

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.c
# Opt level: O1

int convolution_segment_free(mixed_segment *segment)

{
  void *pvVar1;
  
  pvVar1 = segment->data;
  if (pvVar1 != (void *)0x0) {
    if (*(void **)((long)pvVar1 + 0x78) != (void *)0x0) {
      (*mixed_free)(*(void **)((long)pvVar1 + 0x78));
      *(undefined8 *)((long)pvVar1 + 0x78) = 0;
    }
    if (*(void **)((long)pvVar1 + 0x80) != (void *)0x0) {
      (*mixed_free)(*(void **)((long)pvVar1 + 0x80));
      *(undefined8 *)((long)pvVar1 + 0x80) = 0;
    }
    free_fft_window_data((fft_window_data *)((long)pvVar1 + 0x10));
    (*mixed_free)(pvVar1);
  }
  segment->data = (void *)0x0;
  return 1;
}

Assistant:

int convolution_segment_free(struct mixed_segment *segment){
  struct convolution_segment_data *data = (struct convolution_segment_data *)segment->data;
  if(data){
    FREE(data->fir);
    FREE(data->buf);
    free_fft_window_data(&data->fft_window_data);
    mixed_free(data);
  }
  segment->data = 0;
  return 1;
}